

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall libtorrent::torrent_info::~torrent_info(torrent_info *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pdVar4;
  pointer ppVar5;
  pointer piVar6;
  
  pbVar2 = (this->m_info_dict).m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (pointer)0x0) {
    operator_delete(pbVar2,(long)(this->m_info_dict).m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar2);
  }
  pcVar3 = (this->m_created_by)._M_dataplus._M_p;
  paVar1 = &(this->m_created_by).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_comment)._M_dataplus._M_p;
  paVar1 = &(this->m_comment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&(this->m_info_section).pn);
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&(this->m_piece_layers).
             super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           );
  pdVar4 = (this->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->m_merkle_tree).
                                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                 .
                                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_owned_collections);
  ppVar5 = (this->m_collections).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ppVar5 != (pointer)0x0) {
    operator_delete(ppVar5,(long)(this->m_collections).
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar5);
  }
  pdVar4 = (this->m_owned_similar_torrents).
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->m_owned_similar_torrents).
                                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  piVar6 = (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6,(long)(this->m_similar_torrents).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar6);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&this->m_nodes);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::~vector
            (&this->m_web_seeds);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::~vector(&(this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           );
  ::std::
  unique_ptr<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>::
  ~unique_ptr(&(this->m_orig_files).m_ptr);
  file_storage::~file_storage(&this->m_files);
  return;
}

Assistant:

torrent_info::~torrent_info() = default;